

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

bool __thiscall Assembler::checkIfLdStr(Assembler *this,string *line)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  AddressingError *this_00;
  bool local_306;
  int local_2f8;
  string local_2c8;
  byte local_2a1;
  string local_2a0;
  byte local_279;
  string local_278;
  byte local_251;
  string local_250;
  byte local_229;
  string local_228;
  byte local_201;
  string local_200;
  byte local_1d9;
  string local_1d8;
  byte local_1b1;
  string local_1b0;
  byte local_189;
  string local_188;
  byte local_161;
  string local_160;
  string local_140;
  string local_120;
  undefined1 local_100 [8];
  string operand;
  string_type local_d8;
  string local_b8;
  string_type local_98;
  int local_74;
  undefined1 local_70 [4];
  int regD;
  string instruction;
  undefined1 local_40 [8];
  smatch regop;
  string *line_local;
  Assembler *this_local;
  
  regop._M_begin._M_current = (char *)line;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)local_40);
  bVar2 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (line,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_40,&twoOperandInstructionOneRegisterOtherAnyAddrMode_abi_cxx11_,0
                    );
  if (bVar2) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str((string_type *)local_70,
          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)local_40,1);
    operand.field_2._M_local_buf[0xf] = '\0';
    operand.field_2._M_local_buf[0xe] = '\0';
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_98,
          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)local_40,2);
    bVar2 = std::operator==(&local_98,"psw");
    if (bVar2) {
      local_2f8 = 8;
    }
    else {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_d8,
            (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)local_40,2);
      operand.field_2._M_local_buf[0xf] = '\x01';
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_d8);
      operand.field_2._M_local_buf[0xe] = '\x01';
      local_2f8 = literalToDecimal(this,&local_b8);
    }
    if ((operand.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_b8);
    }
    if ((operand.field_2._M_local_buf[0xf] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_d8);
    }
    std::__cxx11::string::~string((string *)&local_98);
    local_74 = local_2f8 << 4;
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str((string_type *)local_100,
          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)local_40,3);
    local_161 = 0;
    local_189 = 0;
    local_1b1 = 0;
    local_1d9 = 0;
    local_201 = 0;
    local_229 = 0;
    local_251 = 0;
    local_279 = 0;
    local_2a1 = 0;
    bVar2 = false;
    std::__cxx11::string::string((string *)&local_120,(string *)local_70);
    iVar1 = local_74;
    std::__cxx11::string::string((string *)&local_140,(string *)local_100);
    bVar3 = checkIfLdStrRegDir(this,&local_120,iVar1,&local_140);
    local_306 = true;
    if (!bVar3) {
      std::__cxx11::string::string((string *)&local_160,(string *)local_70);
      iVar1 = local_74;
      local_161 = 1;
      std::__cxx11::string::string((string *)&local_188,(string *)local_100);
      local_189 = 1;
      bVar3 = checkIfLdStrAbsolute(this,&local_160,iVar1,&local_188);
      local_306 = true;
      if (!bVar3) {
        std::__cxx11::string::string((string *)&local_1b0,(string *)local_70);
        iVar1 = local_74;
        local_1b1 = 1;
        std::__cxx11::string::string((string *)&local_1d8,(string *)local_100);
        local_1d9 = 1;
        bVar3 = checkIfLdStrMemDir(this,&local_1b0,iVar1,&local_1d8);
        local_306 = true;
        if (!bVar3) {
          std::__cxx11::string::string((string *)&local_200,(string *)local_70);
          iVar1 = local_74;
          local_201 = 1;
          std::__cxx11::string::string((string *)&local_228,(string *)local_100);
          local_229 = 1;
          bVar3 = checkIfLdStrPcRel(this,&local_200,iVar1,&local_228);
          local_306 = true;
          if (!bVar3) {
            std::__cxx11::string::string((string *)&local_250,(string *)local_70);
            iVar1 = local_74;
            local_251 = 1;
            std::__cxx11::string::string((string *)&local_278,(string *)local_100);
            local_279 = 1;
            bVar3 = checkIfLdStrRegInd(this,&local_250,iVar1,&local_278);
            local_306 = true;
            if (!bVar3) {
              std::__cxx11::string::string((string *)&local_2a0,(string *)local_70);
              iVar1 = local_74;
              local_2a1 = 1;
              std::__cxx11::string::string((string *)&local_2c8,(string *)local_100);
              bVar2 = true;
              local_306 = checkIfLdStrRegIndDis(this,&local_2a0,iVar1,&local_2c8);
            }
          }
        }
      }
    }
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_2c8);
    }
    if ((local_2a1 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_2a0);
    }
    if ((local_279 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_278);
    }
    if ((local_251 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_250);
    }
    if ((local_229 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_228);
    }
    if ((local_201 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_200);
    }
    if ((local_1d9 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    if ((local_1b1 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    if ((local_189 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_188);
    }
    if ((local_161 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_160);
    }
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    if (local_306 == false) {
      this_00 = (AddressingError *)__cxa_allocate_exception(8);
      *this_00 = (AddressingError)0x0;
      AddressingError::AddressingError(this_00);
      __cxa_throw(this_00,&AddressingError::typeinfo,AddressingError::~AddressingError);
    }
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)local_70);
  }
  else {
    this_local._7_1_ = false;
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_40);
  return this_local._7_1_;
}

Assistant:

bool Assembler::checkIfLdStr(string line) {
    smatch regop;
    if (regex_match(line, regop, twoOperandInstructionOneRegisterOtherAnyAddrMode)) {
        string instruction = regop.str(1);
        int regD = (regop.str(2) == "psw") ? 8 : literalToDecimal(regop.str(2).substr(1));
        regD <<= 4;
        string operand = regop.str(3);
        if (checkIfLdStrRegDir(instruction, regD, operand) || checkIfLdStrAbsolute(instruction, regD, operand) ||
            checkIfLdStrMemDir(instruction, regD, operand) ||
            checkIfLdStrPcRel(instruction, regD, operand) ||
            checkIfLdStrRegInd(instruction, regD, operand) ||
            checkIfLdStrRegIndDis(instruction, regD, operand))
            return true;
        else throw AddressingError();
    }
    return false;
}